

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall doctest::detail::MessageBuilder::~MessageBuilder(MessageBuilder *this)

{
  char *pcVar1;
  void *local_20;
  char local_9;
  
  if (this->logged == false) {
    tlssPop();
    if ((local_9 < '\0') && (local_20 != (void *)0x0)) {
      operator_delete__(local_20);
    }
  }
  if (((this->super_MessageData).m_string.field_0.buf[0x17] < '\0') &&
     (pcVar1 = (this->super_MessageData).m_string.field_0.data.ptr, pcVar1 != (char *)0x0)) {
    operator_delete__(pcVar1);
  }
  return;
}

Assistant:

MessageBuilder::~MessageBuilder() {
        if (!logged)
            tlssPop();
    }